

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

int mpc_parse_run(mpc_input_t *i,mpc_parser_t *p,mpc_result_t *r,mpc_err_t **e,int depth)

{
  mpc_apply_t p_Var1;
  mpc_ctor_t p_Var2;
  long lVar3;
  char *pcVar4;
  char **ppcVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  mpc_err_t *pmVar12;
  mpc_input_t *pmVar13;
  mpc_result_t *xs;
  mpc_result_t mVar14;
  mpc_result_t *pmVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mpc_val_t *pmVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  char *pcVar20;
  mpc_input_t *pmVar21;
  size_t j_1;
  size_t j;
  long lVar22;
  mpc_result_t results_stk [4];
  ulong local_68;
  mpc_result_t local_58;
  mpc_result_t mStack_50;
  mpc_result_t local_48;
  mpc_result_t mStack_40;
  
  if (depth == 1000) {
    pcVar20 = "Maximum recursion depth exceeded!";
    goto LAB_00101f24;
  }
  switch(p->type) {
  case '\0':
    pcVar20 = "Parser Undefined!";
    goto LAB_00101f24;
  case '\x01':
    goto switchD_00101f68_caseD_1;
  case '\x02':
    pcVar20 = (char *)(p->data).lift.lf;
    goto LAB_00101f24;
  case '\x03':
    mVar14.output = (*(p->data).lift.lf)();
    goto LAB_001027d3;
  case '\x04':
    mVar14 = (mpc_result_t)(p->data).lift.x;
    goto LAB_001027d3;
  case '\x05':
    i->suppress = i->suppress + 1;
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    i->suppress = i->suppress + -1;
    if (iVar11 != 0) {
      return 1;
    }
    pcVar20 = (p->data).expect.m;
    goto LAB_00102490;
  case '\x06':
    p_Var2 = (p->data).lift.lf;
    r->error = (mpc_err_t *)0x0;
    cVar9 = i->last;
    cVar8 = mpc_input_peekc(i);
    pmVar16 = (*p_Var2)((ulong)(uint)(int)cVar9,(ulong)(uint)(int)cVar8);
    iVar11 = (int)pmVar16;
    break;
  case '\a':
    mVar14.output = mpc_malloc(i,0x20);
    lVar19 = (i->state).row;
    lVar22 = (i->state).col;
    iVar11 = (i->state).term;
    uVar6 = *(undefined4 *)&(i->state).field_0x1c;
    ((mVar14.error)->state).pos = (i->state).pos;
    ((mVar14.error)->state).row = lVar19;
    ((mVar14.error)->state).col = lVar22;
    ((mpc_state_t *)mVar14)->term = iVar11;
    *(undefined4 *)&((mpc_state_t *)mVar14)->field_0x1c = uVar6;
LAB_001027d3:
    *r = mVar14;
    return 1;
  case '\b':
    iVar11 = mpc_input_any(i,(char **)&r->error);
    break;
  case '\t':
    iVar11 = mpc_input_char(i,(p->data).range.x,(char **)&r->error);
    break;
  case '\n':
    iVar11 = mpc_input_oneof(i,(char *)(p->data).lift.lf,(char **)&r->error);
    break;
  case '\v':
    iVar11 = mpc_input_noneof(i,(char *)(p->data).lift.lf,(char **)&r->error);
    break;
  case '\f':
    iVar11 = mpc_input_range(i,(p->data).range.x,(p->data).range.y,(char **)&r->error);
    break;
  case '\r':
    iVar11 = mpc_input_satisfy(i,(_func_int_char *)(p->data).lift.lf,(char **)&r->error);
    break;
  case '\x0e':
    iVar11 = mpc_input_string(i,(char *)(p->data).lift.lf,(char **)&r->error);
    break;
  case '\x0f':
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar11 != 0) {
      mVar14.output = mpc_parse_apply(i,(p->data).apply.f,r->output);
      goto LAB_001027d3;
    }
    goto LAB_00101f30;
  case '\x10':
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar11 != 0) {
      p_Var1 = (p->data).apply.f;
      pmVar21 = (mpc_input_t *)r->error;
      pmVar13 = pmVar21;
      if (pmVar21 < i + 1 && i->mem <= pmVar21) {
        pmVar13 = (mpc_input_t *)malloc(0x40);
        uVar6 = *(undefined4 *)&pmVar21->field_0x4;
        pcVar20 = pmVar21->filename;
        lVar19 = (pmVar21->state).pos;
        lVar22 = (pmVar21->state).row;
        lVar3 = (pmVar21->state).col;
        iVar11 = (pmVar21->state).term;
        uVar7 = *(undefined4 *)&(pmVar21->state).field_0x1c;
        pcVar4 = pmVar21->string;
        ppcVar5 = (char **)pmVar21->buffer;
        pmVar13->type = pmVar21->type;
        *(undefined4 *)&pmVar13->field_0x4 = uVar6;
        pmVar13->filename = pcVar20;
        (pmVar13->state).pos = lVar19;
        (pmVar13->state).row = lVar22;
        (pmVar13->state).col = lVar3;
        (pmVar13->state).term = iVar11;
        *(undefined4 *)&(pmVar13->state).field_0x1c = uVar7;
        pmVar13->string = pcVar4;
        pmVar13->buffer = (char *)ppcVar5;
        i->mem_full[(ulong)((long)pmVar21 - (long)i->mem) >> 6] = '\0';
      }
      pmVar16 = (*p_Var1)(pmVar13);
      r->output = pmVar16;
      return 1;
    }
    goto LAB_00101f30;
  case '\x11':
    i->backtrack = i->backtrack + -1;
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    i->backtrack = i->backtrack + 1;
    return iVar11;
  case '\x12':
    mpc_input_mark(i);
    i->suppress = i->suppress + 1;
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar11 == 0) {
      pmVar21 = i;
      mpc_input_unmark(i);
      i->suppress = i->suppress + -1;
      mVar14._0_4_ = (*(p->data).check.f)((mpc_val_t **)pmVar21);
      mVar14._4_4_ = extraout_var_00;
      goto LAB_001027d3;
    }
    mpc_input_rewind(i);
    i->suppress = i->suppress + -1;
    mpc_parse_dtor(i,(p->data).check.dx,r->output);
    pcVar20 = "opposite";
LAB_00102490:
    pmVar12 = mpc_err_new(i,pcVar20);
    goto LAB_00101f2c;
  case '\x13':
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    uVar17 = 1;
    if (iVar11 != 0) {
      return 1;
    }
    pmVar12 = mpc_err_merge(i,*e,r->error);
    *e = pmVar12;
    iVar11 = (*(p->data).check.f)((mpc_val_t **)i);
    pmVar12 = (mpc_err_t *)CONCAT44(extraout_var,iVar11);
    goto LAB_00102536;
  case '\x14':
    pmVar15 = &local_58;
    iVar11 = mpc_parse_run(i,(p->data).repeat.x,pmVar15,e,depth + 1);
    if (iVar11 == 0) {
      uVar17 = 0;
      xs = pmVar15;
    }
    else {
      xs = &local_58;
      local_68 = 4;
      lVar22 = 0;
      lVar19 = 8;
      uVar18 = 1;
      iVar11 = 0;
      do {
        if (uVar18 == 4) {
          xs = (mpc_result_t *)mpc_malloc(i,0x30);
          *xs = local_58;
          xs[1] = mStack_50;
          xs[2] = local_48;
          xs[3] = mStack_40;
          local_68 = 6;
        }
        else if ((long)(int)local_68 <= (long)uVar18) {
          local_68 = (ulong)(((uint)(uVar18 >> 1) & 0x7fffffff) + (int)uVar18);
          xs = (mpc_result_t *)mpc_realloc(i,xs,local_68 * 8);
        }
        iVar10 = mpc_parse_run(i,(p->data).repeat.x,(mpc_result_t *)((long)xs + lVar19),e,depth + 1)
        ;
        iVar11 = iVar11 + -1;
        lVar22 = lVar22 + -8;
        lVar19 = lVar19 + 8;
        uVar18 = uVar18 + 1;
      } while (iVar10 != 0);
      uVar17 = -iVar11;
      pmVar15 = (mpc_result_t *)((long)xs - lVar22);
    }
LAB_00102741:
    pmVar12 = mpc_err_merge(i,*e,pmVar15->error);
    *e = pmVar12;
    pmVar16 = mpc_parse_fold(i,(p->data).repeat.f,uVar17,&xs->output);
    r->output = pmVar16;
    iVar11 = 1;
    if (uVar17 < 4) {
      return 1;
    }
    if (xs < (mpc_result_t *)(i + 1) && i->mem <= xs) {
      i->mem_full[(ulong)((long)xs - (long)i->mem) >> 6] = '\0';
      return 1;
    }
LAB_0010298c:
    free(xs);
    return iVar11;
  case '\x15':
    pmVar15 = &local_58;
    iVar11 = mpc_parse_run(i,(p->data).repeat.x,pmVar15,e,depth + 1);
    if (iVar11 == 0) {
      uVar17 = 0;
      xs = pmVar15;
    }
    else {
      xs = &local_58;
      local_68 = 4;
      lVar22 = 0;
      lVar19 = 8;
      uVar18 = 1;
      iVar11 = 0;
      do {
        if (uVar18 == 4) {
          xs = (mpc_result_t *)mpc_malloc(i,0x30);
          *xs = local_58;
          xs[1] = mStack_50;
          xs[2] = local_48;
          xs[3] = mStack_40;
          local_68 = 6;
        }
        else if ((long)(int)local_68 <= (long)uVar18) {
          local_68 = (ulong)(((uint)(uVar18 >> 1) & 0x7fffffff) + (int)uVar18);
          xs = (mpc_result_t *)mpc_realloc(i,xs,local_68 * 8);
        }
        iVar10 = mpc_parse_run(i,(p->data).repeat.x,(mpc_result_t *)((long)xs + lVar19),e,depth + 1)
        ;
        iVar11 = iVar11 + -1;
        lVar22 = lVar22 + -8;
        lVar19 = lVar19 + 8;
        uVar18 = uVar18 + 1;
      } while (iVar10 != 0);
      uVar17 = -iVar11;
      pmVar15 = (mpc_result_t *)((long)xs - lVar22);
    }
    if (uVar17 != 0) goto LAB_00102741;
    pmVar12 = mpc_err_repeat(i,pmVar15->error,"one or more of ");
    goto LAB_00101f2c;
  case '\x16':
    lVar19 = (long)(p->data).repeat.n;
    if (lVar19 < 5) {
      xs = &local_58;
    }
    else {
      xs = (mpc_result_t *)mpc_malloc(i,lVar19 << 3);
    }
    uVar18 = 0;
    pmVar15 = xs;
    do {
      iVar11 = mpc_parse_run(i,(p->data).repeat.x,pmVar15,e,depth + 1);
      if (iVar11 == 0) break;
      uVar18 = uVar18 + 1;
      pmVar15 = pmVar15 + 1;
    } while (uVar18 != (uint)(p->data).repeat.n);
    uVar17 = (uint)uVar18;
    if ((p->data).repeat.n == uVar17) {
      pmVar16 = mpc_parse_fold(i,(p->data).repeat.f,uVar17,&xs->output);
      r->output = pmVar16;
      iVar11 = 1;
      if ((p->data).repeat.n < 5) {
        return 1;
      }
      if (xs < (mpc_result_t *)(i + 1) && i->mem <= xs) {
        i->mem_full[(ulong)((long)xs - (long)i->mem) >> 6] = '\0';
        return 1;
      }
    }
    else {
      if (0 < (int)uVar17) {
        uVar18 = 0;
        do {
          mpc_parse_dtor(i,(p->data).repeat.dx,xs[uVar18].output);
          uVar18 = uVar18 + 1;
        } while ((uVar17 & 0x7fffffff) != uVar18);
      }
      pmVar12 = mpc_err_count(i,xs[(int)uVar17].error,(p->data).repeat.n);
      r->error = pmVar12;
      iVar11 = 0;
      if ((p->data).repeat.n < 5) {
        return 0;
      }
      if (xs < (mpc_result_t *)(i + 1) && i->mem <= xs) {
        i->mem_full[(ulong)((long)xs - (long)i->mem) >> 6] = '\0';
        return 0;
      }
    }
    goto LAB_0010298c;
  case '\x17':
    uVar17 = (p->data).repeat.n;
    if ((ulong)uVar17 != 0) {
      if ((int)uVar17 < 5) {
        xs = &local_58;
      }
      else {
        xs = (mpc_result_t *)mpc_malloc(i,(ulong)uVar17 << 3);
      }
      if (0 < (p->data).repeat.n) {
        lVar19 = 0;
        pmVar15 = xs;
        do {
          iVar11 = mpc_parse_run(i,*(mpc_parser_t **)((long)(p->data).lift.x + lVar19 * 8),pmVar15,e
                                 ,depth + 1);
          if (iVar11 != 0) {
            r->error = (mpc_err_t *)*(mpc_err_t **)pmVar15;
            iVar11 = 1;
            goto LAB_0010295d;
          }
          pmVar12 = mpc_err_merge(i,*e,pmVar15->error);
          *e = pmVar12;
          lVar19 = lVar19 + 1;
          pmVar15 = pmVar15 + 1;
        } while (lVar19 < (p->data).repeat.n);
      }
      r->error = (mpc_err_t *)0x0;
      iVar11 = 0;
LAB_0010295d:
      if ((p->data).repeat.n < 5) {
        return iVar11;
      }
      if (xs < (mpc_result_t *)(i + 1) && i->mem <= xs) {
        i->mem_full[(ulong)((long)xs - (long)i->mem) >> 6] = '\0';
        return iVar11;
      }
      goto LAB_0010298c;
    }
    goto switchD_00101f68_caseD_1;
  case '\x18':
    uVar17 = (p->data).repeat.n;
    if ((ulong)uVar17 != 0) {
      if ((int)uVar17 < 5) {
        xs = &local_58;
      }
      else {
        xs = (mpc_result_t *)mpc_malloc(i,(ulong)uVar17 << 3);
      }
      mpc_input_mark(i);
      if (0 < (p->data).repeat.n) {
        lVar19 = 0;
LAB_00102803:
        iVar11 = mpc_parse_run(i,*(mpc_parser_t **)((long)(p->data).apply_to.d + lVar19 * 8),
                               xs + lVar19,e,depth + 1);
        if (iVar11 != 0) goto code_r0x0010282c;
        mpc_input_rewind(i);
        if (lVar19 != 0) {
          lVar22 = 0;
          do {
            mpc_parse_dtor(i,*(mpc_dtor_t *)((p->data).check.e + lVar22 * 8),xs[lVar22].output);
            lVar22 = lVar22 + 1;
          } while (lVar19 != lVar22);
        }
        *r = xs[lVar19];
        iVar11 = 0;
        goto LAB_0010291d;
      }
      lVar19 = 0;
LAB_001028b1:
      mpc_input_unmark(i);
      pmVar16 = mpc_parse_fold(i,(p->data).repeat.f,(int)lVar19,&xs->output);
      r->output = pmVar16;
      iVar11 = 1;
LAB_0010291d:
      if ((p->data).repeat.n < 5) {
        return iVar11;
      }
      if (xs < (mpc_result_t *)(i + 1) && i->mem <= xs) {
        i->mem_full[(ulong)((long)xs - (long)i->mem) >> 6] = '\0';
        return iVar11;
      }
      goto LAB_0010298c;
    }
switchD_00101f68_caseD_1:
    r->error = (mpc_err_t *)0x0;
    return 1;
  case '\x19':
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar11 == 0) {
      return 0;
    }
    iVar11 = (*(p->data).check.f)(&r->output);
    if (iVar11 != 0) {
      return 1;
    }
    mpc_parse_dtor(i,(p->data).check.dx,r->output);
    pcVar20 = (p->data).check.e;
    goto LAB_00101f24;
  case '\x1a':
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar11 == 0) {
      return 0;
    }
    iVar11 = (*(p->data).check.f)(&r->output);
    if (iVar11 != 0) {
      return 1;
    }
    mpc_parse_dtor(i,(p->data).check.dx,r->output);
    pcVar20 = (p->data).check_with.e;
    goto LAB_00101f24;
  case '\x1b':
    pmVar12 = (mpc_err_t *)0x0;
    r->error = (mpc_err_t *)0x0;
    uVar17 = (uint)(i->last == '\0');
LAB_00102536:
    r->error = pmVar12;
    return uVar17;
  case '\x1c':
    r->error = (mpc_err_t *)0x0;
    if (((i->state).term == 0) && (cVar9 = mpc_input_peekc(i), cVar9 == '\0')) {
      (i->state).term = 1;
      return 1;
    }
    goto LAB_001024c6;
  default:
    pcVar20 = "Unknown Parser Type Id!";
LAB_00101f24:
    pmVar12 = mpc_err_fail(i,pcVar20);
LAB_00101f2c:
    r->error = pmVar12;
    goto LAB_00101f30;
  }
  iVar10 = 1;
  if (iVar11 == 0) {
LAB_001024c6:
    r->error = (mpc_err_t *)0x0;
LAB_00101f30:
    iVar10 = 0;
  }
  return iVar10;
code_r0x0010282c:
  lVar19 = lVar19 + 1;
  if ((p->data).repeat.n <= lVar19) goto LAB_001028b1;
  goto LAB_00102803;
}

Assistant:

static int mpc_parse_run(mpc_input_t *i, mpc_parser_t *p, mpc_result_t *r, mpc_err_t **e, int depth) {

  int j = 0, k = 0;
  mpc_result_t results_stk[MPC_PARSE_STACK_MIN];
  mpc_result_t *results;
  int results_slots = MPC_PARSE_STACK_MIN;

  if (depth == MPC_MAX_RECURSION_DEPTH)
  {
    MPC_FAILURE(mpc_err_fail(i, "Maximum recursion depth exceeded!"));
  }

  switch (p->type) {

    /* Basic Parsers */

    case MPC_TYPE_ANY:     MPC_PRIMITIVE(mpc_input_any(i, (char**)&r->output));
    case MPC_TYPE_SINGLE:  MPC_PRIMITIVE(mpc_input_char(i, p->data.single.x, (char**)&r->output));
    case MPC_TYPE_RANGE:   MPC_PRIMITIVE(mpc_input_range(i, p->data.range.x, p->data.range.y, (char**)&r->output));
    case MPC_TYPE_ONEOF:   MPC_PRIMITIVE(mpc_input_oneof(i, p->data.string.x, (char**)&r->output));
    case MPC_TYPE_NONEOF:  MPC_PRIMITIVE(mpc_input_noneof(i, p->data.string.x, (char**)&r->output));
    case MPC_TYPE_SATISFY: MPC_PRIMITIVE(mpc_input_satisfy(i, p->data.satisfy.f, (char**)&r->output));
    case MPC_TYPE_STRING:  MPC_PRIMITIVE(mpc_input_string(i, p->data.string.x, (char**)&r->output));
    case MPC_TYPE_ANCHOR:  MPC_PRIMITIVE(mpc_input_anchor(i, p->data.anchor.f, (char**)&r->output));
    case MPC_TYPE_SOI:     MPC_PRIMITIVE(mpc_input_soi(i, (char**)&r->output));
    case MPC_TYPE_EOI:     MPC_PRIMITIVE(mpc_input_eoi(i, (char**)&r->output));

    /* Other parsers */

    case MPC_TYPE_UNDEFINED: MPC_FAILURE(mpc_err_fail(i, "Parser Undefined!"));
    case MPC_TYPE_PASS:      MPC_SUCCESS(NULL);
    case MPC_TYPE_FAIL:      MPC_FAILURE(mpc_err_fail(i, p->data.fail.m));
    case MPC_TYPE_LIFT:      MPC_SUCCESS(p->data.lift.lf());
    case MPC_TYPE_LIFT_VAL:  MPC_SUCCESS(p->data.lift.x);
    case MPC_TYPE_STATE:     MPC_SUCCESS(mpc_input_state_copy(i));

    /* Application Parsers */

    case MPC_TYPE_APPLY:
      if (mpc_parse_run(i, p->data.apply.x, r, e, depth+1)) {
        MPC_SUCCESS(mpc_parse_apply(i, p->data.apply.f, r->output));
      } else {
        MPC_FAILURE(r->output);
      }

    case MPC_TYPE_APPLY_TO:
      if (mpc_parse_run(i, p->data.apply_to.x, r, e, depth+1)) {
        MPC_SUCCESS(mpc_parse_apply_to(i, p->data.apply_to.f, r->output, p->data.apply_to.d));
      } else {
        MPC_FAILURE(r->error);
      }

    case MPC_TYPE_CHECK:
      if (mpc_parse_run(i, p->data.check.x, r, e, depth+1)) {
        if (p->data.check.f(&r->output)) {
          MPC_SUCCESS(r->output);
        } else {
          mpc_parse_dtor(i, p->data.check.dx, r->output);
          MPC_FAILURE(mpc_err_fail(i, p->data.check.e));
        }
      } else {
        MPC_FAILURE(r->error);
      }

    case MPC_TYPE_CHECK_WITH:
      if (mpc_parse_run(i, p->data.check_with.x, r, e, depth+1)) {
        if (p->data.check_with.f(&r->output, p->data.check_with.d)) {
          MPC_SUCCESS(r->output);
        } else {
          mpc_parse_dtor(i, p->data.check.dx, r->output);
          MPC_FAILURE(mpc_err_fail(i, p->data.check_with.e));
        }
      } else {
        MPC_FAILURE(r->error);
      }

    case MPC_TYPE_EXPECT:
      mpc_input_suppress_enable(i);
      if (mpc_parse_run(i, p->data.expect.x, r, e, depth+1)) {
        mpc_input_suppress_disable(i);
        MPC_SUCCESS(r->output);
      } else {
        mpc_input_suppress_disable(i);
        MPC_FAILURE(mpc_err_new(i, p->data.expect.m));
      }

    case MPC_TYPE_PREDICT:
      mpc_input_backtrack_disable(i);
      if (mpc_parse_run(i, p->data.predict.x, r, e, depth+1)) {
        mpc_input_backtrack_enable(i);
        MPC_SUCCESS(r->output);
      } else {
        mpc_input_backtrack_enable(i);
        MPC_FAILURE(r->error);
      }

    /* Optional Parsers */

    /* TODO: Update Not Error Message */

    case MPC_TYPE_NOT:
      mpc_input_mark(i);
      mpc_input_suppress_enable(i);
      if (mpc_parse_run(i, p->data.not.x, r, e, depth+1)) {
        mpc_input_rewind(i);
        mpc_input_suppress_disable(i);
        mpc_parse_dtor(i, p->data.not.dx, r->output);
        MPC_FAILURE(mpc_err_new(i, "opposite"));
      } else {
        mpc_input_unmark(i);
        mpc_input_suppress_disable(i);
        MPC_SUCCESS(p->data.not.lf());
      }

    case MPC_TYPE_MAYBE:
      if (mpc_parse_run(i, p->data.not.x, r, e, depth+1)) {
        MPC_SUCCESS(r->output);
      } else {
        *e = mpc_err_merge(i, *e, r->error);
        MPC_SUCCESS(p->data.not.lf());
      }

    /* Repeat Parsers */

    case MPC_TYPE_MANY:

      results = results_stk;

      while (mpc_parse_run(i, p->data.repeat.x, &results[j], e, depth+1)) {
        j++;
        if (j == MPC_PARSE_STACK_MIN) {
          results_slots = j + j / 2;
          results = mpc_malloc(i, sizeof(mpc_result_t) * results_slots);
          memcpy(results, results_stk, sizeof(mpc_result_t) * MPC_PARSE_STACK_MIN);
        } else if (j >= results_slots) {
          results_slots = j + j / 2;
          results = mpc_realloc(i, results, sizeof(mpc_result_t) * results_slots);
        }
      }

      *e = mpc_err_merge(i, *e, results[j].error);

      MPC_SUCCESS(
        mpc_parse_fold(i, p->data.repeat.f, j, (mpc_val_t**)results);
        if (j >= MPC_PARSE_STACK_MIN) { mpc_free(i, results); });

    case MPC_TYPE_MANY1:

      results = results_stk;

      while (mpc_parse_run(i, p->data.repeat.x, &results[j], e, depth+1)) {
        j++;
        if (j == MPC_PARSE_STACK_MIN) {
          results_slots = j + j / 2;
          results = mpc_malloc(i, sizeof(mpc_result_t) * results_slots);
          memcpy(results, results_stk, sizeof(mpc_result_t) * MPC_PARSE_STACK_MIN);
        } else if (j >= results_slots) {
          results_slots = j + j / 2;
          results = mpc_realloc(i, results, sizeof(mpc_result_t) * results_slots);
        }
      }

      if (j == 0) {
        MPC_FAILURE(
          mpc_err_many1(i, results[j].error);
          if (j >= MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      } else {

        *e = mpc_err_merge(i, *e, results[j].error);

        MPC_SUCCESS(
          mpc_parse_fold(i, p->data.repeat.f, j, (mpc_val_t**)results);
          if (j >= MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      }

    case MPC_TYPE_COUNT:

      results = p->data.repeat.n > MPC_PARSE_STACK_MIN
        ? mpc_malloc(i, sizeof(mpc_result_t) * p->data.repeat.n)
        : results_stk;

      while (mpc_parse_run(i, p->data.repeat.x, &results[j], e, depth+1)) {
        j++;
        if (j == p->data.repeat.n) { break; }
      }

      if (j == p->data.repeat.n) {
        MPC_SUCCESS(
          mpc_parse_fold(i, p->data.repeat.f, j, (mpc_val_t**)results);
          if (p->data.repeat.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      } else {
        for (k = 0; k < j; k++) {
          mpc_parse_dtor(i, p->data.repeat.dx, results[k].output);
        }
        MPC_FAILURE(
          mpc_err_count(i, results[j].error, p->data.repeat.n);
          if (p->data.repeat.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      }

    /* Combinatory Parsers */

    case MPC_TYPE_OR:

      if (p->data.or.n == 0) { MPC_SUCCESS(NULL); }

      results = p->data.or.n > MPC_PARSE_STACK_MIN
        ? mpc_malloc(i, sizeof(mpc_result_t) * p->data.or.n)
        : results_stk;

      for (j = 0; j < p->data.or.n; j++) {
        if (mpc_parse_run(i, p->data.or.xs[j], &results[j], e, depth+1)) {
          MPC_SUCCESS(results[j].output;
            if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
        } else {
          *e = mpc_err_merge(i, *e, results[j].error);
        }
      }

      MPC_FAILURE(NULL;
        if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });

    case MPC_TYPE_AND:

      if (p->data.and.n == 0) { MPC_SUCCESS(NULL); }

      results = p->data.or.n > MPC_PARSE_STACK_MIN
        ? mpc_malloc(i, sizeof(mpc_result_t) * p->data.or.n)
        : results_stk;

      mpc_input_mark(i);
      for (j = 0; j < p->data.and.n; j++) {
        if (!mpc_parse_run(i, p->data.and.xs[j], &results[j], e, depth+1)) {
          mpc_input_rewind(i);
          for (k = 0; k < j; k++) {
            mpc_parse_dtor(i, p->data.and.dxs[k], results[k].output);
          }
          MPC_FAILURE(results[j].error;
            if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
        }
      }
      mpc_input_unmark(i);
      MPC_SUCCESS(
        mpc_parse_fold(i, p->data.and.f, j, (mpc_val_t**)results);
        if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });

    /* End */

    default:

      MPC_FAILURE(mpc_err_fail(i, "Unknown Parser Type Id!"));
  }

  return 0;

}